

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O3

void __thiscall cmCommand::~cmCommand(cmCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppcVar3;
  
  (this->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c7f88;
  pcVar2 = (this->Error)._M_dataplus._M_p;
  paVar1 = &(this->Error).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppcVar3 = (this->Helper).Arguments.
            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3,(long)(this->Helper).Arguments.
                                  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar3
                   );
    return;
  }
  return;
}

Assistant:

virtual ~cmCommand() {}